

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleGLCoverageTests.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GLCoverageExtensionSpecificEnumsAreRecognizedTest::iterate
          (GLCoverageExtensionSpecificEnumsAreRecognizedTest *this)

{
  ostringstream *poVar1;
  undefined4 uVar2;
  uint uVar3;
  GLCoverageExtensionSpecificEnumsAreRecognizedTest *pGVar4;
  GLCoverageExtensionSpecificEnumsAreRecognizedTest *pGVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar10;
  float fVar11;
  float fVar12;
  GLint int_value;
  GLboolean bool_value_1;
  GLboolean bool_value;
  GLfloat float_value;
  uint local_1c4;
  char local_1bd;
  float local_1bc;
  GLCoverageExtensionSpecificEnumsAreRecognizedTest *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar9;
  
  bVar6 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_OES_texture_storage_multisample_2d_array");
  this->gl_oes_texture_storage_multisample_2d_array_supported = bVar6;
  local_1b8 = this;
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar7);
  lVar10 = 0;
  do {
    uVar2 = *(undefined4 *)((long)&DAT_01b60d00 + lVar10);
    local_1c4 = 0xffffffff;
    (**(code **)(lVar9 + 0x868))(uVar2,&local_1c4);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glGetIntegerv() reported an error for a valid pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                    ,0x6b);
    if ((int)local_1c4 < 1) {
      local_1b0._0_8_ = ((local_1b8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"An invalid integer value ",0x19);
      std::ostream::operator<<(poVar1,local_1c4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," was reported for pname [",0x19);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"].",2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid integer value reported for pname.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                 ,0x72);
      goto LAB_00ca769e;
    }
    local_1bd = '\x01';
    (**(code **)(lVar9 + 0x798))(uVar2,&local_1bd);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glGetBooleanv() reported an error for a valid pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                    ,0x79);
    if ((local_1c4 != 0 && local_1bd == '\0') || (local_1bd != '\0' && local_1c4 == 0)) {
      local_1b0._0_8_ = ((local_1b8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"An invalid boolean value [",0x1a);
      local_1bc = (float)CONCAT31(local_1bc._1_3_,local_1bd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_1bc,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," was reported for pname [",0x19);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," (integer value reported for the same property:",0x2f);
      std::ostream::operator<<(poVar1,local_1c4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid boolean value reported for pname.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                 ,0x82);
      goto LAB_00ca769e;
    }
    local_1bc = -1.0;
    (**(code **)(lVar9 + 0x818))(uVar2,&local_1bc);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glGetFloatv() reported an error for a valid pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                    ,0x89);
    fVar11 = local_1bc - (float)(int)local_1c4;
    fVar12 = -fVar11;
    if (-fVar11 <= fVar11) {
      fVar12 = fVar11;
    }
    if (1e-05 < fVar12) {
      local_1b0._0_8_ = ((local_1b8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"An invalid floating-point value [",0x21);
      std::ostream::_M_insert<double>((double)local_1bc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," was reported for pname        [",0x20);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," (integer value reported for the same property:",0x2f);
      std::ostream::operator<<(poVar1,local_1c4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid floating-point value reported for pname.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                 ,0x92);
      goto LAB_00ca769e;
    }
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x10);
  local_1bc = (float)CONCAT31(local_1bc._1_3_,1);
  local_1b0._0_4_ = 0x3f800000;
  local_1c4 = 1;
  (**(code **)(lVar9 + 0x798))(0x9104,&local_1bc);
  (**(code **)(lVar9 + 0x818))(0x9104,local_1b0);
  (**(code **)(lVar9 + 0x868))(0x9104,&local_1c4);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,
                  "GL_TEXTURE_BINDING_2D_MULTISAMPLE pname was not recognized by one of the glGet*() functions"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0xa1);
  pGVar4 = local_1b8;
  if (local_1bc._0_1_ == '\0') {
    fVar12 = -(float)local_1b0._0_4_;
    if (-(float)local_1b0._0_4_ <= (float)local_1b0._0_4_) {
      fVar12 = (float)local_1b0._0_4_;
    }
    if ((fVar12 <= 1e-05) && (local_1c4 == 0)) {
      if (local_1b8->gl_oes_texture_storage_multisample_2d_array_supported == '\0') {
LAB_00ca70b1:
        (**(code **)(lVar9 + 0x6f8))(1,&pGVar4->to_id_2d_multisample);
        if (pGVar4->gl_oes_texture_storage_multisample_2d_array_supported != '\0') {
          (**(code **)(lVar9 + 0x6f8))(1,&pGVar4->to_id_2d_multisample_array);
        }
        dVar8 = (**(code **)(lVar9 + 0x800))();
        glu::checkError(dVar8,"glGenTextures() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                        ,0xc6);
        (**(code **)(lVar9 + 0xb8))(0x9100,pGVar4->to_id_2d_multisample);
        if (pGVar4->gl_oes_texture_storage_multisample_2d_array_supported != '\0') {
          (**(code **)(lVar9 + 0xb8))(0x9102,pGVar4->to_id_2d_multisample_array);
        }
        dVar8 = (**(code **)(lVar9 + 0x800))();
        glu::checkError(dVar8,"glBindTexture() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                        ,0xd0);
        local_1bc = (float)((uint)local_1bc & 0xffffff00);
        local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
        local_1c4 = 0;
        (**(code **)(lVar9 + 0x798))(0x9104,&local_1bc);
        (**(code **)(lVar9 + 0x818))(0x9104,local_1b0);
        (**(code **)(lVar9 + 0x868))(0x9104,&local_1c4);
        dVar8 = (**(code **)(lVar9 + 0x800))();
        glu::checkError(dVar8,
                        "GL_TEXTURE_BINDING_2D_MULTISAMPLE pname was not recognized by one of the glGet*() functions"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                        ,0xdc);
        pGVar5 = local_1b8;
        if (local_1bc._0_1_ == '\x01') {
          uVar3 = pGVar4->to_id_2d_multisample;
          fVar11 = (float)local_1b0._0_4_ - (float)uVar3;
          fVar12 = -fVar11;
          if (-fVar11 <= fVar11) {
            fVar12 = fVar11;
          }
          if ((fVar12 <= 1e-05) && (local_1c4 == uVar3)) {
            if (local_1b8->gl_oes_texture_storage_multisample_2d_array_supported == '\0') {
LAB_00ca72b8:
              tcu::TestContext::setTestResult
                        ((pGVar5->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                         QP_TEST_RESULT_PASS,"Pass");
              return STOP;
            }
            local_1bc = (float)((uint)local_1bc & 0xffffff00);
            local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
            local_1c4 = 0;
            (**(code **)(lVar9 + 0x798))(0x9105,&local_1bc);
            (**(code **)(lVar9 + 0x818))(0x9105,local_1b0);
            (**(code **)(lVar9 + 0x868))(0x9105,&local_1c4);
            dVar8 = (**(code **)(lVar9 + 0x800))();
            glu::checkError(dVar8,
                            "GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES pname was not recognized by one of the glGet*() functions"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                            ,0xf2);
            if (local_1bc._0_1_ == '\x01') {
              uVar3 = pGVar5->to_id_2d_multisample_array;
              fVar11 = (float)local_1b0._0_4_ - (float)uVar3;
              fVar12 = -fVar11;
              if (-fVar11 <= fVar11) {
                fVar12 = fVar11;
              }
              if ((fVar12 <= 1e-05) && (local_1c4 == uVar3)) goto LAB_00ca72b8;
            }
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES value is invalid",
                       (char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                       ,0xf9);
            goto LAB_00ca769e;
          }
        }
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"GL_TEXTURE_BINDING_2D_MULTISAMPLE value is invalid",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                   ,0xe3);
      }
      else {
        local_1bc = (float)CONCAT31(local_1bc._1_3_,1);
        local_1b0._0_4_ = 0x3f800000;
        local_1c4 = 1;
        (**(code **)(lVar9 + 0x798))(0x9105,&local_1bc);
        (**(code **)(lVar9 + 0x818))(0x9105,local_1b0);
        (**(code **)(lVar9 + 0x868))(0x9105,&local_1c4);
        dVar8 = (**(code **)(lVar9 + 0x800))();
        glu::checkError(dVar8,
                        "GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES pname was not recognized by one of the glGet*() functions"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                        ,0xb4);
        if (local_1bc._0_1_ == '\0') {
          fVar12 = -(float)local_1b0._0_4_;
          if (-(float)local_1b0._0_4_ <= (float)local_1b0._0_4_) {
            fVar12 = (float)local_1b0._0_4_;
          }
          if ((fVar12 <= 1e-05) && (local_1c4 == 0)) goto LAB_00ca70b1;
        }
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Default GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES value is invalid",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                   ,0xb8);
      }
      goto LAB_00ca769e;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Default GL_TEXTURE_BINDING_2D_MULTISAMPLE value is invalid",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
             ,0xa5);
LAB_00ca769e:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GLCoverageExtensionSpecificEnumsAreRecognizedTest::iterate()
{
	gl_oes_texture_storage_multisample_2d_array_supported =
		m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array");

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Iterate through all pnames that need to be verified */
	const glw::GLenum pnames[] = { GL_MAX_SAMPLE_MASK_WORDS, GL_MAX_COLOR_TEXTURE_SAMPLES, GL_MAX_DEPTH_TEXTURE_SAMPLES,
								   GL_MAX_INTEGER_SAMPLES };
	const unsigned int n_pnames = sizeof(pnames) / sizeof(pnames[0]);

	for (unsigned int n_pname = 0; n_pname < n_pnames; ++n_pname)
	{
		const float epsilon = (float)1e-5;
		glw::GLenum pname   = pnames[n_pname];

		/* Test glGetIntegerv() */
		glw::GLint int_value = -1;

		gl.getIntegerv(pname, &int_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() reported an error for a valid pname");

		if (int_value < 1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "An invalid integer value " << int_value
							   << " was reported for pname [" << pname << "]." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid integer value reported for pname.");
		}

		/* Test glGetBooleanv() */
		glw::GLboolean bool_value = GL_TRUE;

		gl.getBooleanv(pname, &bool_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() reported an error for a valid pname");

		if ((int_value != 0 && bool_value == GL_FALSE) || (int_value == 0 && bool_value != GL_FALSE))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "An invalid boolean value [" << bool_value << "]"
							   << " was reported for pname [" << pname << "]"
							   << " (integer value reported for the same property:" << int_value << ")"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid boolean value reported for pname.");
		}

		/* Test glGetFloatv() */
		glw::GLfloat float_value = -1.0f;

		gl.getFloatv(pname, &float_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() reported an error for a valid pname");

		if (de::abs(float_value - float(int_value)) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "An invalid floating-point value [" << float_value << "]"
							   << " was reported for pname        [" << pname << "]"
							   << " (integer value reported for the same property:" << int_value << ")"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid floating-point value reported for pname.");
		}
	} /* for (all pnames) */

	/* Verify default multisample texture bindings are valid */
	glw::GLboolean bool_value  = GL_TRUE;
	const float	epsilon	 = (float)1e-5;
	glw::GLfloat   float_value = 1.0f;
	glw::GLint	 int_value   = 1;

	gl.getBooleanv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &bool_value);
	gl.getFloatv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &float_value);
	gl.getIntegerv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(),
						"GL_TEXTURE_BINDING_2D_MULTISAMPLE pname was not recognized by one of the glGet*() functions");

	if (bool_value != GL_FALSE || de::abs(float_value) > epsilon || int_value != 0)
	{
		TCU_FAIL("Default GL_TEXTURE_BINDING_2D_MULTISAMPLE value is invalid");
	}

	if (gl_oes_texture_storage_multisample_2d_array_supported)
	{
		bool_value  = GL_TRUE;
		float_value = 1.0f;
		int_value   = 1;

		gl.getBooleanv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &bool_value);
		gl.getFloatv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &float_value);
		gl.getIntegerv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &int_value);

		GLU_EXPECT_NO_ERROR(
			gl.getError(),
			"GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES pname was not recognized by one of the glGet*() functions");

		if (bool_value != GL_FALSE || de::abs(float_value) > epsilon || int_value != 0)
		{
			TCU_FAIL("Default GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES value is invalid");
		}
	}

	/* Generate two texture objects we will later bind to multisample texture targets to
	 * verify the values reported for corresponding pnames have also changed.
	 */
	gl.genTextures(1, &to_id_2d_multisample);

	if (gl_oes_texture_storage_multisample_2d_array_supported)
	{
		gl.genTextures(1, &to_id_2d_multisample_array);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed");

	/* Now bind the IDs to relevant texture targets */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id_2d_multisample);

	if (gl_oes_texture_storage_multisample_2d_array_supported)
	{
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_id_2d_multisample_array);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() failed");

	/* Verify new bindings are reported */
	bool_value  = GL_FALSE;
	float_value = 0.0f;
	int_value   = 0;

	gl.getBooleanv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &bool_value);
	gl.getFloatv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &float_value);
	gl.getIntegerv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(),
						"GL_TEXTURE_BINDING_2D_MULTISAMPLE pname was not recognized by one of the glGet*() functions");

	glw::GLfloat expected_float_value = float(to_id_2d_multisample);

	if (bool_value != GL_TRUE || de::abs(float_value - expected_float_value) > epsilon ||
		(glw::GLuint)int_value != to_id_2d_multisample)
	{
		TCU_FAIL("GL_TEXTURE_BINDING_2D_MULTISAMPLE value is invalid");
	}

	if (gl_oes_texture_storage_multisample_2d_array_supported)
	{
		bool_value  = GL_FALSE;
		float_value = 0.0f;
		int_value   = 0;

		gl.getBooleanv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &bool_value);
		gl.getFloatv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &float_value);
		gl.getIntegerv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &int_value);

		GLU_EXPECT_NO_ERROR(
			gl.getError(),
			"GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES pname was not recognized by one of the glGet*() functions");

		expected_float_value = float(to_id_2d_multisample_array);

		if (bool_value != GL_TRUE || de::abs(float_value - expected_float_value) > epsilon ||
			(glw::GLuint)int_value != to_id_2d_multisample_array)
		{
			TCU_FAIL("GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES value is invalid");
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}